

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

void __thiscall PDA::Transducer::StoreFst::expandCurrentNTerminal(StoreFst *this)

{
  int iVar1;
  bool bVar2;
  vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_> *pvVar3;
  reference pvVar4;
  size_type sVar5;
  wstring *pwVar6;
  reference __x;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_38;
  const_reverse_iterator it;
  wstring currentChain;
  StoreFst *this_local;
  
  std::vector<wchar_t,_std::allocator<wchar_t>_>::pop_back(&(this->m_currentState).m_stack);
  (this->m_currentState).m_chainIndex = (this->m_currentState).m_chainIndex + 1;
  iVar1 = (this->m_currentState).m_chainIndex;
  pvVar3 = Grammar::rules(&this->m_grammar);
  pvVar4 = std::
           vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>::
           operator[](pvVar3,(long)(this->m_currentState).m_ruleIndex);
  sVar5 = std::
          vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
          ::size(&pvVar4->m_chains);
  if (iVar1 < (int)sVar5) {
    pvVar3 = Grammar::rules(&this->m_grammar);
    pvVar4 = std::
             vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
             ::operator[](pvVar3,(long)(this->m_currentState).m_ruleIndex);
    pwVar6 = (wstring *)
             std::
             vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
             ::operator[](&pvVar4->m_chains,(long)(this->m_currentState).m_chainIndex);
    std::__cxx11::wstring::wstring((wstring *)&it,pwVar6);
    std::__cxx11::wstring::crbegin();
    while( true ) {
      std::__cxx11::wstring::crend();
      bVar2 = std::operator!=(&local_38,&local_40);
      if (!bVar2) break;
      __x = std::
            reverse_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::operator*(&local_38);
      std::vector<wchar_t,_std::allocator<wchar_t>_>::push_back(&(this->m_currentState).m_stack,__x)
      ;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator++(&local_38);
    }
    (this->m_currentState).m_ruleIndex = -1;
    std::__cxx11::wstring::~wstring((wstring *)&it);
  }
  else {
    rollback(this);
  }
  return;
}

Assistant:

void expandCurrentNTerminal()
    {
        m_currentState.m_stack.pop_back();
        ++m_currentState.m_chainIndex;
        if ( m_currentState.m_chainIndex >= static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size()))
        {
            rollback();
            return;
        }
        std::wstring currentChain = m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains[static_cast<size_t>(m_currentState.m_chainIndex)].m_chain;
        for(auto it = currentChain.crbegin(); it != currentChain.crend(); ++it)
            m_currentState.m_stack.push_back(*it);
        m_currentState.m_ruleIndex = -1;
    }